

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-validator.cpp
# Opt level: O0

void __thiscall wasm::FunctionValidator::visitStructSet(FunctionValidator *this,StructSet *curr)

{
  uint uVar1;
  bool bVar2;
  Module *pMVar3;
  Struct *this_00;
  size_type sVar4;
  const_reference pvVar5;
  value_type *field;
  FieldList *fields;
  HeapType local_28;
  HeapType type;
  StructSet *curr_local;
  FunctionValidator *this_local;
  
  pMVar3 = Walker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>::getModule
                     (&(this->
                       super_WalkerPass<wasm::PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>_>
                       ).
                       super_PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
                       .
                       super_Walker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
                     );
  bVar2 = FeatureSet::hasGC(&pMVar3->features);
  shouldBeTrue<wasm::StructSet*>(this,bVar2,curr,"struct.set requires gc [--enable-gc]");
  type.id._4_4_ = 1;
  bVar2 = wasm::Type::operator==(&curr->ref->type,(BasicType *)((long)&type.id + 4));
  if (!bVar2) {
    bVar2 = wasm::Type::isRef(&curr->ref->type);
    bVar2 = shouldBeTrue<wasm::Expression*>
                      (this,bVar2,curr->ref,"struct.set ref must be a reference type");
    if (bVar2) {
      local_28 = wasm::Type::getHeapType(&curr->ref->type);
      fields._4_4_ = 0xb;
      bVar2 = HeapType::operator==(&local_28,(BasicHeapType *)((long)&fields + 4));
      if (!bVar2) {
        bVar2 = HeapType::isStruct(&local_28);
        bVar2 = shouldBeTrue<wasm::Expression*>
                          (this,bVar2,curr->ref,"struct.set ref must be a struct");
        if (bVar2) {
          this_00 = HeapType::getStruct(&local_28);
          uVar1 = curr->index;
          sVar4 = std::vector<wasm::Field,_std::allocator<wasm::Field>_>::size(&this_00->fields);
          shouldBeTrue<wasm::StructSet*>(this,uVar1 < sVar4,curr,"bad struct.get field");
          pvVar5 = std::vector<wasm::Field,_std::allocator<wasm::Field>_>::operator[]
                             (&this_00->fields,(ulong)curr->index);
          shouldBeSubType(this,(Type)(curr->value->type).id,(Type)(pvVar5->type).id,
                          (Expression *)curr,"struct.set must have the proper type");
          shouldBeEqual<wasm::StructSet*,wasm::Mutability>
                    (this,pvVar5->mutable_,Mutable,curr,"struct.set field must be mutable");
        }
      }
    }
  }
  return;
}

Assistant:

void FunctionValidator::visitStructSet(StructSet* curr) {
  shouldBeTrue(getModule()->features.hasGC(),
               curr,
               "struct.set requires gc [--enable-gc]");
  if (curr->ref->type == Type::unreachable) {
    return;
  }
  if (!shouldBeTrue(curr->ref->type.isRef(),
                    curr->ref,
                    "struct.set ref must be a reference type")) {
    return;
  }
  auto type = curr->ref->type.getHeapType();
  if (type == HeapType::none) {
    return;
  }
  if (!shouldBeTrue(
        type.isStruct(), curr->ref, "struct.set ref must be a struct")) {
    return;
  }
  const auto& fields = type.getStruct().fields;
  shouldBeTrue(curr->index < fields.size(), curr, "bad struct.get field");
  auto& field = fields[curr->index];
  shouldBeSubType(curr->value->type,
                  field.type,
                  curr,
                  "struct.set must have the proper type");
  shouldBeEqual(
    field.mutable_, Mutable, curr, "struct.set field must be mutable");
}